

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
ExprTest_HashNumericVarArgExpr_Test::~ExprTest_HashNumericVarArgExpr_Test
          (ExprTest_HashNumericVarArgExpr_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a79f8;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashNumericVarArgExpr) {
  // Test computing hash for numeric expressions with abitrary numeric
  // arguments: VarArgExpr, SumExpr, NumberOfExpr.
  NumericExpr args[] = { MakeVariable(0), MakeVariable(1), MakeConst(42)};
  CheckHash(MakeIterated(expr::MIN, args));
  CheckHash(MakeIterated(expr::SUM, args));
  CheckHash(MakeIterated(expr::NUMBEROF, args));
}